

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPetNet.cpp
# Opt level: O0

void __thiscall NaPetriNet::initialize(NaPetriNet *this,bool bDoPrintouts)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  NaPetriNode **ppNVar4;
  undefined4 *puVar5;
  char *pcVar6;
  size_t sVar7;
  char *pcVar8;
  char *__src;
  byte in_SIL;
  long in_RDI;
  bool bVar9;
  NaException exCode;
  char *szNodeVerbose;
  bool bVerbose;
  bool bStarter;
  int iNode;
  int in_stack_fffffffffffffefc;
  NaDynAr<NaPetriNode_*> *in_stack_ffffffffffffff00;
  byte local_11;
  int local_10;
  byte local_9;
  
  local_9 = in_SIL & 1;
  if ((*(byte *)(in_RDI + 0x38) & 1) != 0) {
    local_9 = *(byte *)(in_RDI + 0x38) & 1;
  }
  local_10 = 0;
  while( true ) {
    iVar1 = local_10;
    iVar2 = NaDynAr<NaPetriNode_*>::count((NaDynAr<NaPetriNode_*> *)(in_RDI + 0x40));
    if (iVar2 <= iVar1) {
      return;
    }
    local_11 = 0;
    bVar9 = false;
    ppNVar4 = NaDynAr<NaPetriNode_*>::operator[]
                        (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
    if (*ppNVar4 == (NaPetriNode *)0x0) break;
    ppNVar4 = NaDynAr<NaPetriNode_*>::operator[]
                        (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
    pcVar6 = NaPetriNode::name(*ppNVar4);
    sVar7 = strlen(pcVar6);
    if (sVar7 != 0) {
      ppNVar4 = NaDynAr<NaPetriNode_*>::operator[]
                          (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
      pcVar6 = NaPetriNode::name(*ppNVar4);
      sVar7 = strlen(pcVar6);
      pcVar8 = (char *)operator_new__(sVar7 + 9);
      pcVar6 = pcVar8;
      ppNVar4 = NaDynAr<NaPetriNode_*>::operator[]
                          (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
      __src = NaPetriNode::name(*ppNVar4);
      pcVar8 = strcpy(pcVar8,__src);
      strcat(pcVar8,"_verbose");
      pcVar8 = getenv(pcVar6);
      if (pcVar8 != (char *)0x0) {
        pcVar8 = getenv(pcVar6);
        sVar7 = strlen(pcVar8);
        bVar9 = sVar7 != 0;
      }
      if (pcVar6 != (char *)0x0) {
        operator_delete__(pcVar6);
      }
    }
    if ((local_9 & 1) != 0) {
      ppNVar4 = NaDynAr<NaPetriNode_*>::operator[]
                          (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
      pcVar6 = NaPetriNode::name(*ppNVar4);
      NaPrintLog("node \'%s\'\n",pcVar6);
    }
    if (bVar9 != false) {
      ppNVar4 = NaDynAr<NaPetriNode_*>::operator[]
                          (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
      (*(*ppNVar4)->_vptr_NaPetriNode[4])(*ppNVar4,(ulong)bVar9);
    }
    ppNVar4 = NaDynAr<NaPetriNode_*>::operator[]
                        (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
    uVar3 = (*(*ppNVar4)->_vptr_NaPetriNode[3])();
    if ((uVar3 & 1) != 0) {
      ppNVar4 = NaDynAr<NaPetriNode_*>::operator[]
                          (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
      pcVar6 = NaPetriNode::name(*ppNVar4);
      NaPrintLog("node \'%s\' is VERBOSE\n",pcVar6);
    }
    ppNVar4 = NaDynAr<NaPetriNode_*>::operator[]
                        (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
    (*(*ppNVar4)->_vptr_NaPetriNode[0x10])(*ppNVar4,&local_11);
    if (((local_11 & 1) != 0) && ((local_9 & 1) != 0)) {
      ppNVar4 = NaDynAr<NaPetriNode_*>::operator[]
                          (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
      in_stack_ffffffffffffff00 = (NaDynAr<NaPetriNode_*> *)NaPetriNode::name(*ppNVar4);
      NaPrintLog("node \'%s\' is starter.\n",in_stack_ffffffffffffff00);
    }
    local_10 = local_10 + 1;
  }
  puVar5 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar5 = 0;
  __cxa_throw(puVar5,&NaException::typeinfo,0);
}

Assistant:

void
NaPetriNet::initialize (bool bDoPrintouts)
{
    int     iNode;

    if(bInitPrintout)
      bDoPrintouts = bInitPrintout;

    // 6. Initialize node activity and setup starter flag if needed
    for(iNode = 0; iNode < pnaNet.count(); ++iNode){
        try{
            bool    bStarter = false;
	    bool    bVerbose = false;

	    if(NULL == pnaNet[iNode])
	      throw(na_null_pointer);

	    // Check for verbosity set in env. variable
	    if(strlen(pnaNet[iNode]->name()) > 0){
	      char	*szNodeVerbose = new char[strlen(pnaNet[iNode]->name())
						 + sizeof("_verbose")];
	      strcat(strcpy(szNodeVerbose, pnaNet[iNode]->name()), "_verbose");
	      if(NULL != getenv(szNodeVerbose))
		if(strlen(getenv(szNodeVerbose)) > 0)
		  bVerbose = true;
	      delete[] szNodeVerbose;
	    }

            if(bDoPrintouts){
                NaPrintLog("node '%s'\n", pnaNet[iNode]->name());
            }

	    // Don't touch verbosity in case of direct setting from
	    // the program...
	    if(bVerbose)
	      pnaNet[iNode]->verbose(bVerbose);

	    // ...but inform an user in log file anyway
	    if(pnaNet[iNode]->is_verbose())
	      NaPrintLog("node '%s' is VERBOSE\n", pnaNet[iNode]->name());

            pnaNet[iNode]->initialize(bStarter);

            if(bStarter){
                if(bDoPrintouts){
                    NaPrintLog("node '%s' is starter.\n",
                               pnaNet[iNode]->name());
                }

                // Each starter node must commit output data at initialize
                // phase of execution due to semantics may be complicated
                // enough and be obscured from net.
                //OLD If the node is starter then it produced output data
                //OLD on the initialize phase already
                //OLD pnaNet[iNode]->commit_data(pckOutput);
            }
        }catch(NaException exCode){
            NaPrintLog("Initialization phase (#6): node '%s' fault.\n"
                       "Caused by exception: %s\n",
                       pnaNet[iNode]->name(), NaExceptionMsg(exCode));
        }
    }
}